

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

Mat3x3d * __thiscall
OpenMD::Thermo::getSystemQuadrupole(Mat3x3d *__return_storage_ptr__,Thermo *this)

{
  double dVar1;
  RealType RVar2;
  bool bVar3;
  uint i;
  Molecule *pMVar4;
  long lVar5;
  double *pdVar6;
  double (*padVar7) [3];
  uint i_1;
  long lVar8;
  double *pdVar9;
  uint j;
  Atom *this_00;
  Snapshot *this_01;
  pointer ppAVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  RectMatrix<double,_3U,_3U> result_1;
  SquareMatrix3<double> result;
  FluctuatingChargeAdapter fqa;
  MoleculeIterator miter;
  Mat3x3d qpole;
  Vector3d local_1d8;
  Snapshot *local_1c0;
  MultipoleAdapter local_1b8;
  FixedChargeAdapter local_1b0;
  double local_1a8 [10];
  double local_158 [10];
  double local_108 [4];
  Mat3x3d *local_e8;
  Thermo *local_e0;
  FluctuatingChargeAdapter local_d8;
  MoleculeIterator local_d0;
  Mat3x3d local_c8;
  double local_78 [9];
  
  this_01 = this->info_->sman_->currentSnapshot_;
  local_e0 = this;
  if (this_01->hasSystemQuadrupole == false) {
    local_d0._M_node = (_Base_ptr)0x0;
    local_1d8.super_Vector<double,_3U>.data_[2] = 0.0;
    local_1d8.super_Vector<double,_3U>.data_[0] = 0.0;
    local_1d8.super_Vector<double,_3U>.data_[1] = 0.0;
    local_108[2] = 0.0;
    local_108[0] = 0.0;
    local_108[1] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_c8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_1c0 = this_01;
    local_e8 = __return_storage_ptr__;
    pMVar4 = SimInfo::beginMolecule(this->info_,&local_d0);
    if (pMVar4 != (Molecule *)0x0) {
      do {
        ppAVar10 = (pMVar4->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        while( true ) {
          if (ppAVar10 ==
              (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            this_00 = (Atom *)0x0;
          }
          else {
            this_00 = *ppAVar10;
          }
          if (this_00 == (Atom *)0x0) break;
          lVar5 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (this_00->super_StuntDouble).storage_);
          lVar8 = (long)(this_00->super_StuntDouble).localIndex_;
          pdVar6 = (double *)(lVar5 + lVar8 * 0x18);
          local_1d8.super_Vector<double,_3U>.data_[0] = *pdVar6;
          local_1d8.super_Vector<double,_3U>.data_[1] = pdVar6[1];
          local_1d8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar5 + 0x10 + lVar8 * 0x18);
          Snapshot::wrapVector(local_1c0,&local_1d8);
          lVar5 = 0;
          do {
            local_1d8.super_Vector<double,_3U>.data_[lVar5] =
                 local_1d8.super_Vector<double,_3U>.data_[lVar5] * 1e-10;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
          local_1b0.at_ = this_00->atomType_;
          bVar3 = FixedChargeAdapter::isFixedCharge(&local_1b0);
          uVar11 = 0;
          uVar12 = 0;
          if (bVar3) {
            RVar2 = FixedChargeAdapter::getCharge(&local_1b0);
            uVar11 = SUB84(RVar2,0);
            uVar12 = (undefined4)((ulong)RVar2 >> 0x20);
          }
          dVar13 = (double)CONCAT44(uVar12,uVar11);
          local_d8.at_ = this_00->atomType_;
          bVar3 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_d8);
          if (bVar3) {
            dVar13 = dVar13 + *(double *)
                               (*(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->
                                                  currentSnapshot_->atomData).flucQPos.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start +
                                         (this_00->super_StuntDouble).storage_) +
                               (long)(this_00->super_StuntDouble).localIndex_ * 8);
          }
          local_158[6] = 0.0;
          local_158[7] = 0.0;
          local_158[4] = 0.0;
          local_158[5] = 0.0;
          local_158[2] = 0.0;
          local_158[3] = 0.0;
          local_158[0] = 0.0;
          local_158[1] = 0.0;
          local_158[8] = 0.0;
          lVar5 = 0;
          pdVar6 = local_158;
          do {
            dVar1 = local_1d8.super_Vector<double,_3U>.data_[lVar5];
            lVar8 = 0;
            do {
              pdVar6[lVar8] = local_1d8.super_Vector<double,_3U>.data_[lVar8] * dVar1;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            lVar5 = lVar5 + 1;
            pdVar6 = pdVar6 + 3;
          } while (lVar5 != 3);
          local_1a8[6] = 0.0;
          local_1a8[7] = 0.0;
          local_1a8[4] = 0.0;
          local_1a8[5] = 0.0;
          local_1a8[2] = 0.0;
          local_1a8[3] = 0.0;
          local_1a8[0] = 0.0;
          local_1a8[1] = 0.0;
          local_1a8[8] = 0.0;
          lVar5 = 0;
          pdVar6 = local_158;
          pdVar9 = local_1a8;
          do {
            lVar8 = 0;
            do {
              pdVar9[lVar8] = pdVar6[lVar8] * dVar13 * 1.60217733e-19 * 0.5;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            lVar5 = lVar5 + 1;
            pdVar9 = pdVar9 + 3;
            pdVar6 = pdVar6 + 3;
          } while (lVar5 != 3);
          lVar5 = 0;
          pdVar6 = local_1a8;
          padVar7 = (double (*) [3])&local_c8;
          do {
            lVar8 = 0;
            do {
              (((SquareMatrix<double,_3> *)*padVar7)->super_RectMatrix<double,_3U,_3U>).data_[0]
              [lVar8] = pdVar6[lVar8] +
                        (((SquareMatrix<double,_3> *)*padVar7)->super_RectMatrix<double,_3U,_3U>).
                        data_[0][lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            lVar5 = lVar5 + 1;
            padVar7 = padVar7 + 1;
            pdVar6 = pdVar6 + 3;
          } while (lVar5 != 3);
          local_1b8.at_ = this_00->atomType_;
          bVar3 = MultipoleAdapter::isDipole(&local_1b8);
          if (bVar3) {
            lVar8 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar5 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).dipole.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (this_00->super_StuntDouble).storage_);
            local_158[2] = (double)*(undefined8 *)(lVar5 + 0x10 + lVar8 * 0x18);
            pdVar6 = (double *)(lVar5 + lVar8 * 0x18);
            local_158[0] = *pdVar6;
            local_158[1] = pdVar6[1];
            local_1a8[0] = 0.0;
            local_1a8[1] = 0.0;
            local_1a8[2] = 0.0;
            lVar5 = 0;
            do {
              local_1a8[lVar5] = local_158[lVar5] * 3.33564095198e-30;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            local_108[2] = local_1a8[2];
            local_108[0] = local_1a8[0];
            local_108[1] = local_1a8[1];
            local_158[6] = 0.0;
            local_158[7] = 0.0;
            local_158[4] = 0.0;
            local_158[5] = 0.0;
            local_158[2] = 0.0;
            local_158[3] = 0.0;
            local_158[0] = 0.0;
            local_158[1] = 0.0;
            local_158[8] = 0.0;
            lVar5 = 0;
            pdVar6 = local_158;
            do {
              dVar13 = local_108[lVar5];
              lVar8 = 0;
              do {
                pdVar6[lVar8] = local_1d8.super_Vector<double,_3U>.data_[lVar8] * dVar13;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar5 = lVar5 + 1;
              pdVar6 = pdVar6 + 3;
            } while (lVar5 != 3);
            local_1a8[6] = 0.0;
            local_1a8[7] = 0.0;
            local_1a8[4] = 0.0;
            local_1a8[5] = 0.0;
            local_1a8[2] = 0.0;
            local_1a8[3] = 0.0;
            local_1a8[0] = 0.0;
            local_1a8[1] = 0.0;
            local_1a8[8] = 0.0;
            lVar5 = 0;
            pdVar6 = local_158;
            pdVar9 = local_1a8;
            do {
              lVar8 = 0;
              do {
                pdVar9[lVar8] = pdVar6[lVar8] * 0.5;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar5 = lVar5 + 1;
              pdVar9 = pdVar9 + 3;
              pdVar6 = pdVar6 + 3;
            } while (lVar5 != 3);
            lVar5 = 0;
            pdVar6 = local_1a8;
            padVar7 = (double (*) [3])&local_c8;
            do {
              lVar8 = 0;
              do {
                (*padVar7)[lVar8] = pdVar6[lVar8] + (*padVar7)[lVar8];
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar5 = lVar5 + 1;
              padVar7 = padVar7 + 1;
              pdVar6 = pdVar6 + 3;
            } while (lVar5 != 3);
            local_158[6] = 0.0;
            local_158[7] = 0.0;
            local_158[4] = 0.0;
            local_158[5] = 0.0;
            local_158[2] = 0.0;
            local_158[3] = 0.0;
            local_158[0] = 0.0;
            local_158[1] = 0.0;
            local_158[8] = 0.0;
            lVar5 = 0;
            pdVar6 = local_158;
            do {
              dVar13 = local_1d8.super_Vector<double,_3U>.data_[lVar5];
              lVar8 = 0;
              do {
                pdVar6[lVar8] = local_108[lVar8] * dVar13;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar5 = lVar5 + 1;
              pdVar6 = pdVar6 + 3;
            } while (lVar5 != 3);
            local_1a8[6] = 0.0;
            local_1a8[7] = 0.0;
            local_1a8[4] = 0.0;
            local_1a8[5] = 0.0;
            local_1a8[2] = 0.0;
            local_1a8[3] = 0.0;
            local_1a8[0] = 0.0;
            local_1a8[1] = 0.0;
            local_1a8[8] = 0.0;
            lVar5 = 0;
            pdVar6 = local_158;
            pdVar9 = local_1a8;
            do {
              lVar8 = 0;
              do {
                pdVar9[lVar8] = pdVar6[lVar8] * 0.5;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar5 = lVar5 + 1;
              pdVar9 = pdVar9 + 3;
              pdVar6 = pdVar6 + 3;
            } while (lVar5 != 3);
            lVar5 = 0;
            pdVar6 = local_1a8;
            padVar7 = (double (*) [3])&local_c8;
            do {
              lVar8 = 0;
              do {
                (*padVar7)[lVar8] = pdVar6[lVar8] + (*padVar7)[lVar8];
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar5 = lVar5 + 1;
              padVar7 = padVar7 + 1;
              pdVar6 = pdVar6 + 3;
            } while (lVar5 != 3);
          }
          bVar3 = MultipoleAdapter::isQuadrupole(&local_1b8);
          if (bVar3) {
            padVar7 = (double (*) [3])local_78;
            StuntDouble::getQuadrupole((Mat3x3d *)padVar7,&this_00->super_StuntDouble);
            local_158[6] = 0.0;
            local_158[7] = 0.0;
            local_158[4] = 0.0;
            local_158[5] = 0.0;
            local_158[2] = 0.0;
            local_158[3] = 0.0;
            local_158[0] = 0.0;
            local_158[1] = 0.0;
            local_158[8] = 0.0;
            lVar5 = 0;
            pdVar6 = local_158;
            do {
              lVar8 = 0;
              do {
                pdVar6[lVar8] =
                     (((SquareMatrix<double,_3> *)*padVar7)->super_RectMatrix<double,_3U,_3U>).data_
                     [0][lVar8] * 3.33564095198e-30;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar5 = lVar5 + 1;
              pdVar6 = pdVar6 + 3;
              padVar7 = padVar7 + 1;
            } while (lVar5 != 3);
            local_1a8[6] = 0.0;
            local_1a8[7] = 0.0;
            local_1a8[4] = 0.0;
            local_1a8[5] = 0.0;
            local_1a8[2] = 0.0;
            local_1a8[3] = 0.0;
            local_1a8[0] = 0.0;
            local_1a8[1] = 0.0;
            local_1a8[8] = 0.0;
            lVar5 = 0;
            pdVar6 = local_158;
            pdVar9 = local_1a8;
            do {
              lVar8 = 0;
              do {
                pdVar9[lVar8] = pdVar6[lVar8] * 1e-10;
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar5 = lVar5 + 1;
              pdVar9 = pdVar9 + 3;
              pdVar6 = pdVar6 + 3;
            } while (lVar5 != 3);
            lVar5 = 0;
            pdVar6 = local_1a8;
            padVar7 = (double (*) [3])&local_c8;
            do {
              lVar8 = 0;
              do {
                (*padVar7)[lVar8] = pdVar6[lVar8] + (*padVar7)[lVar8];
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              lVar5 = lVar5 + 1;
              padVar7 = padVar7 + 1;
              pdVar6 = pdVar6 + 3;
            } while (lVar5 != 3);
          }
          ppAVar10 = ppAVar10 + 1;
        }
        pMVar4 = SimInfo::nextMolecule(local_e0->info_,&local_d0);
      } while (pMVar4 != (Molecule *)0x0);
    }
    this_01 = local_1c0;
    Snapshot::setSystemQuadrupole(local_1c0,&local_c8);
    __return_storage_ptr__ = local_e8;
  }
  Snapshot::getSystemQuadrupole(__return_storage_ptr__,this_01);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Thermo::getSystemQuadrupole() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasSystemQuadrupole) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator aiter;
      Molecule* mol;
      Atom* atom;
      RealType charge;
      Vector3d ri(0.0);
      Vector3d dipole(0.0);
      Mat3x3d qpole(0.0);

      RealType chargeToC   = 1.60217733e-19;
      RealType angstromToM = 1.0e-10;
      RealType debyeToCm   = 3.33564095198e-30;

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginAtom(aiter); atom != NULL;
             atom = mol->nextAtom(aiter)) {
          ri = atom->getPos();
          snap->wrapVector(ri);
          ri *= angstromToM;

          charge = 0.0;

          FixedChargeAdapter fca = FixedChargeAdapter(atom->getAtomType());
          if (fca.isFixedCharge()) { charge = fca.getCharge(); }

          FluctuatingChargeAdapter fqa =
              FluctuatingChargeAdapter(atom->getAtomType());
          if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

          charge *= chargeToC;

          qpole += 0.5 * charge * outProduct(ri, ri);

          MultipoleAdapter ma = MultipoleAdapter(atom->getAtomType());

          if (ma.isDipole()) {
            dipole = atom->getDipole() * debyeToCm;
            qpole += 0.5 * outProduct(dipole, ri);
            qpole += 0.5 * outProduct(ri, dipole);
          }

          if (ma.isQuadrupole()) {
            qpole += atom->getQuadrupole() * debyeToCm * angstromToM;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, qpole.getArrayPointer(), 9, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      snap->setSystemQuadrupole(qpole);
    }

    return snap->getSystemQuadrupole();
  }